

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::trainThread(FastText *this,int32_t threadId)

{
  real lr_00;
  element_type *peVar1;
  long lVar2;
  int64_t iVar3;
  Dictionary *this_00;
  element_type *peVar4;
  Model *this_01;
  Model *model_00;
  __int_type _Var5;
  int in_ESI;
  Model *in_RDI;
  float fVar6;
  real lr;
  real progress;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  int64_t localTokenCount;
  int64_t ntokens;
  Model model;
  ifstream ifs;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  real in_stack_fffffffffffffbd4;
  float in_stack_fffffffffffffbd8;
  real in_stack_fffffffffffffbdc;
  ifstream *in_stack_fffffffffffffbe0;
  undefined1 *puVar7;
  Dictionary *this_02;
  FastText *this_03;
  int32_t seed;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffc50;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffc58;
  Model *in_stack_fffffffffffffc60;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc78;
  ifstream *piVar8;
  Model *model_01;
  FastText *in_stack_fffffffffffffc90;
  minstd_rand *in_stack_fffffffffffffcd0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcd8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffce0;
  istream *in_stack_fffffffffffffce8;
  Dictionary *in_stack_fffffffffffffcf0;
  FastText local_218 [5];
  int local_c;
  
  local_c = in_ESI;
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13a428);
  this_03 = local_218;
  std::ifstream::ifstream(this_03,(string *)peVar1,_S_in);
  lVar2 = (long)local_c;
  iVar3 = utils::size((ifstream *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  this_00 = (Dictionary *)(lVar2 * iVar3);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13a47d);
  seed = (int32_t)((ulong)iVar3 >> 0x20);
  utils::seek(in_stack_fffffffffffffbe0,
              CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  std::shared_ptr<fasttext::Matrix>::shared_ptr
            ((shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffbc8);
  puVar7 = &stack0xfffffffffffffcd0;
  std::shared_ptr<fasttext::Matrix>::shared_ptr
            ((shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffbc8);
  this_02 = (Dictionary *)&stack0xfffffffffffffcc0;
  std::shared_ptr<fasttext::Args>::shared_ptr
            ((shared_ptr<fasttext::Args> *)
             CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (shared_ptr<fasttext::Args> *)in_stack_fffffffffffffbc8);
  Model::Model(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
               (shared_ptr<fasttext::Args> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),seed);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x13a523);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x13a530);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x13a53d);
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13a547);
  if (peVar1->model == sup) {
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13a562);
    Dictionary::getCounts(this_02,(entry_type)((ulong)puVar7 >> 0x38));
    Model::setTargetCounts
              ((Model *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               in_stack_fffffffffffffbc8);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffbe0);
  }
  else {
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13a648);
    Dictionary::getCounts(this_02,(entry_type)((ulong)puVar7 >> 0x38));
    Model::setTargetCounts
              ((Model *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               in_stack_fffffffffffffbc8);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffbe0);
  }
  peVar4 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13a6b6);
  this_01 = (Model *)Dictionary::ntokens(peVar4);
  piVar8 = (ifstream *)0x0;
  model_01 = this_01;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13a6eb);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13a6f8);
  while( true ) {
    model_00 = (Model *)std::__atomic_base::operator_cast_to_long
                                  ((__atomic_base<long> *)
                                   CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13a715);
    if ((long)peVar1->epoch * (long)model_01 <= (long)model_00) break;
    _Var5 = std::__atomic_base::operator_cast_to_long
                      ((__atomic_base<long> *)
                       CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13a759);
    fVar6 = (float)_Var5 / (float)((long)peVar1->epoch * (long)model_01);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x13a78e);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13a7ce);
    lr_00 = (real)Dictionary::getLine(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                                      in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                                      in_stack_fffffffffffffcd0);
    piVar8 = piVar8 + (int)lr_00;
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13a81c);
    if (peVar1->model == sup) {
      peVar4 = std::
               __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13a837);
      std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x13a846);
      Dictionary::addNgrams
                (this_00,(vector<int,_std::allocator<int>_> *)this_02,
                 (int32_t)((ulong)puVar7 >> 0x20));
      supervised((FastText *)this_01,model_00,lr_00,(vector<int,_std::allocator<int>_> *)peVar4,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe0);
      in_stack_fffffffffffffbe0 = piVar8;
    }
    else {
      peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13a8cf);
      if (peVar1->model == cbow) {
        cbow(in_stack_fffffffffffffc90,model_01,(real)((ulong)piVar8 >> 0x20),
             in_stack_fffffffffffffc78);
        in_stack_fffffffffffffbe0 = piVar8;
      }
      else {
        peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13a909);
        in_stack_fffffffffffffbe0 = piVar8;
        if (peVar1->model == sg) {
          skipgram(this_03,in_RDI,(real)((ulong)this_00 >> 0x20),
                   (vector<int,_std::allocator<int>_> *)this_02);
          in_stack_fffffffffffffbe0 = piVar8;
        }
      }
    }
    piVar8 = in_stack_fffffffffffffbe0;
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13a954);
    if ((long)peVar1->lrUpdateRate < (long)in_stack_fffffffffffffbe0) {
      std::__atomic_base<long>::operator+=((__atomic_base<long> *)&in_RDI->grad_,(__int_type)piVar8)
      ;
      piVar8 = (ifstream *)0x0;
      if ((local_c == 0) &&
         (peVar1 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13a99e), 1 < peVar1->verbose)) {
        in_stack_fffffffffffffbdc = Model::getLoss((Model *)&stack0xfffffffffffffcf0);
        printInfo((FastText *)this_00,(real)((ulong)this_02 >> 0x20),SUB84(this_02,0));
        in_stack_fffffffffffffbd8 = fVar6;
      }
    }
  }
  if ((local_c == 0) &&
     (peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13aa00), 0 < peVar1->verbose)) {
    in_stack_fffffffffffffbd4 = Model::getLoss((Model *)&stack0xfffffffffffffcf0);
    printInfo((FastText *)this_00,(real)((ulong)this_02 >> 0x20),SUB84(this_02,0));
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::ifstream::close();
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe0);
  Model::~Model((Model *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void FastText::trainThread(int32_t threadId) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model model(input_, output_, args_, threadId);
  
  if (args_->model == model_name::sup) {
    model.setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model.setTargetCounts(dict_->getCounts(entry_type::word));
  }

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  while (tokenCount < args_->epoch * ntokens) {
    real progress = real(tokenCount) / (args_->epoch * ntokens);
    real lr = args_->lr * (1.0 - progress);
    localTokenCount += dict_->getLine(ifs, line, labels, model.rng);
    if (args_->model == model_name::sup) {
      dict_->addNgrams(line, args_->wordNgrams);
      supervised(model, lr, line, labels);
    } else if (args_->model == model_name::cbow) {
      cbow(model, lr, line);
    } else if (args_->model == model_name::sg) {
      skipgram(model, lr, line);
    }
    if (localTokenCount > args_->lrUpdateRate) {
      tokenCount += localTokenCount;
      localTokenCount = 0;
      if (threadId == 0 && args_->verbose > 1) {
        printInfo(progress, model.getLoss());
      }
    }
  }
  if (threadId == 0 && args_->verbose > 0) {
    printInfo(1.0, model.getLoss());
    std::cout << std::endl;
  }
  ifs.close();
}